

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_binaryop_eltwise(NetOptimize *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  Layer *pLVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  undefined4 *puVar7;
  pointer piVar8;
  int iVar9;
  int iVar10;
  Layer *pLVar11;
  int *piVar12;
  bool *pbVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ParamDict pd;
  Mat local_88;
  ParamDict local_40;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar15 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar15 != 0) {
    lVar15 = lVar15 >> 3;
    lVar14 = 0;
    do {
      iVar9 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar14]->type);
      if (iVar9 == 0) {
        pLVar3 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar14];
        piVar12 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((((long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar12 == 8) &&
            (*(int *)&pLVar3[1]._vptr_Layer == 0)) &&
           (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0)) {
          if (lVar14 == 0) {
            lVar18 = 0;
LAB_00169005:
            lVar17 = 0;
          }
          else {
            iVar9 = *piVar12;
            iVar1 = piVar12[1];
            lVar17 = 0;
            do {
              iVar10 = std::__cxx11::string::compare
                                 ((char *)&(((this->super_ModelWriter).layers)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[lVar17]->type)
              ;
              if (((iVar10 == 0) &&
                  (pLVar4 = (((this->super_ModelWriter).layers)->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[lVar17],
                  (long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  *(long *)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data == 4)) &&
                 ((*(int *)&pLVar4[1]._vptr_Layer == 2 &&
                  (*(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start == iVar9)))) {
                lVar18 = lVar17;
                if (lVar14 == 0) goto LAB_00169005;
                break;
              }
              lVar17 = lVar17 + 1;
              lVar18 = lVar14;
            } while (lVar14 != lVar17);
            lVar16 = 0;
            do {
              iVar9 = std::__cxx11::string::compare
                                ((char *)&(((this->super_ModelWriter).layers)->
                                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start[lVar16]->type);
              if (((iVar9 == 0) &&
                  (pLVar4 = (((this->super_ModelWriter).layers)->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[lVar16],
                  (long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  *(long *)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data == 4)) &&
                 ((*(int *)&pLVar4[1]._vptr_Layer == 2 &&
                  (lVar17 = lVar16,
                  *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start == iVar1)))) break;
              lVar16 = lVar16 + 1;
              lVar17 = lVar14;
            } while (lVar14 != lVar16);
          }
          if ((lVar18 != lVar14) || (lVar17 != lVar14)) {
            ppLVar5 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar5[lVar18];
            pLVar6 = ppLVar5[lVar17];
            fprintf(_stderr,"fuse_binaryop_eltwise %s %s %s\n",(pLVar4->name)._M_dataplus._M_p,
                    (pLVar6->name)._M_dataplus._M_p,(pLVar3->name)._M_dataplus._M_p);
            pLVar11 = ncnn::create_layer("Eltwise");
            std::__cxx11::string::_M_replace
                      ((ulong)&pLVar11->type,0,(char *)(pLVar11->type)._M_string_length,0x522529);
            std::__cxx11::string::_M_assign((string *)&pLVar11->name);
            this_00 = &pLVar11->bottoms;
            std::vector<int,_std::allocator<int>_>::operator=(this_00,&pLVar3->bottoms);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar11->tops,&pLVar3->tops);
            ncnn::ParamDict::ParamDict(&local_40);
            (*pLVar11->_vptr_Layer[2])(pLVar11,&local_40);
            *(undefined4 *)&pLVar11[1]._vptr_Layer = 1;
            local_88.cstep = 0;
            local_88.data = (void *)0x0;
            local_88.refcount._0_4_ = 0;
            local_88.refcount._4_4_ = 0;
            local_88.elemsize._0_4_ = 0;
            local_88.elemsize._4_4_ = 0;
            local_88.elempack = 0;
            local_88.h = 0;
            local_88.d = 0;
            local_88.c = 0;
            local_88.allocator = (Allocator *)0x0;
            local_88.dims = 0;
            local_88.w = 0;
            ncnn::Mat::create(&local_88,2,4,(Allocator *)0x0);
            pbVar13 = &pLVar11[1].one_blob_only;
            piVar12 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
            if ((Mat *)pbVar13 != &local_88) {
              if (piVar12 != (int *)0x0) {
                LOCK();
                *piVar12 = *piVar12 + 1;
                UNLOCK();
              }
              piVar12 = *(int **)&pLVar11[1].support_tensor_storage;
              if (piVar12 != (int *)0x0) {
                LOCK();
                *piVar12 = *piVar12 + -1;
                UNLOCK();
                if (*piVar12 == 0) {
                  if (*(long **)&pLVar11[1].typeindex == (long *)0x0) {
                    if (*(void **)&pLVar11[1].one_blob_only != (void *)0x0) {
                      free(*(void **)&pLVar11[1].one_blob_only);
                    }
                  }
                  else {
                    (**(code **)(**(long **)&pLVar11[1].typeindex + 0x18))();
                  }
                }
              }
              *(void **)&pLVar11[1].one_blob_only = local_88.data;
              piVar12 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
              *(int **)&pLVar11[1].support_tensor_storage = piVar12;
              pLVar11[1].support_reserved_6 = (bool)(char)(undefined4)local_88.elemsize;
              pLVar11[1].support_reserved_7 = (bool)(char)((uint)(undefined4)local_88.elemsize >> 8)
              ;
              pLVar11[1].support_reserved_8 =
                   (bool)(char)((uint)(undefined4)local_88.elemsize >> 0x10);
              pLVar11[1].support_reserved_9 =
                   (bool)(char)((uint)(undefined4)local_88.elemsize >> 0x18);
              pLVar11[1].support_reserved_10 = (bool)(char)local_88.elemsize._4_4_;
              pLVar11[1].support_reserved_11 = (bool)(char)((uint)local_88.elemsize._4_4_ >> 8);
              pLVar11[1].support_reserved_12 = (bool)(char)((uint)local_88.elemsize._4_4_ >> 0x10);
              pLVar11[1].support_reserved_13 = (bool)(char)((uint)local_88.elemsize._4_4_ >> 0x18);
              *(int *)&pLVar11[1].userdata = local_88.elempack;
              *(Allocator **)&pLVar11[1].typeindex = local_88.allocator;
              *(int *)&pLVar11[1].type._M_dataplus._M_p = local_88.dims;
              *(int *)((long)&pLVar11[1].type._M_dataplus._M_p + 4) = local_88.w;
              *(int *)&pLVar11[1].type._M_string_length = local_88.h;
              *(int *)((long)&pLVar11[1].type._M_string_length + 4) = local_88.d;
              *(int *)&pLVar11[1].type.field_2 = local_88.c;
              *(size_t *)((long)&pLVar11[1].type.field_2 + 8) = local_88.cstep;
            }
            if (piVar12 != (int *)0x0) {
              LOCK();
              *piVar12 = *piVar12 + -1;
              UNLOCK();
              if (*piVar12 == 0) {
                if (local_88.allocator == (Allocator *)0x0) {
                  if (local_88.data != (void *)0x0) {
                    free(local_88.data);
                  }
                }
                else {
                  (*(local_88.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (lVar18 != lVar14 && lVar17 != lVar14) {
              puVar7 = *(undefined4 **)pbVar13;
              *puVar7 = *(undefined4 *)&pLVar4[1].one_blob_only;
              puVar7[1] = *(undefined4 *)&pLVar6[1].one_blob_only;
              piVar8 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              *piVar8 = *(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              piVar8[1] = *(pLVar6->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
              std::__cxx11::string::_M_replace
                        ((ulong)&pLVar4->type,0,(char *)(pLVar4->type)._M_string_length,0x52219a);
              std::__cxx11::string::_M_replace
                        ((ulong)&pLVar6->type,0,(char *)(pLVar6->type)._M_string_length,0x52219a);
            }
            if (lVar18 != lVar14 && lVar17 == lVar14) {
              puVar7 = *(undefined4 **)pbVar13;
              *puVar7 = *(undefined4 *)&pLVar4[1].one_blob_only;
              puVar7[1] = 0x3f800000;
              *(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start =
                   *(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
              std::__cxx11::string::_M_replace
                        ((ulong)&pLVar4->type,0,(char *)(pLVar4->type)._M_string_length,0x52219a);
            }
            if (lVar17 != lVar14 && lVar18 == lVar14) {
              puVar7 = *(undefined4 **)pbVar13;
              *puVar7 = 0x3f800000;
              puVar7[1] = *(undefined4 *)&pLVar6[1].one_blob_only;
              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[1] =
                   *(pLVar6->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
              std::__cxx11::string::_M_replace
                        ((ulong)&pLVar6->type,0,(char *)(pLVar6->type)._M_string_length,0x52219a);
            }
            (((this->super_ModelWriter).layers)->
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar14] = pLVar11;
            (*pLVar3->_vptr_Layer[1])(pLVar3);
            ncnn::ParamDict::~ParamDict(&local_40);
          }
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar15 + (ulong)(lVar15 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_binaryop_eltwise()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "BinaryOp")
            continue;

        if (layers[i]->bottoms.size() != 2)
            continue;

        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[i];

        if (binaryop->op_type != ncnn::BinaryOp::Operation_ADD)
            continue;

        if (binaryop->with_scalar)
            continue;

        // BinaryOp - BinaryOp - BinaryOp
        int bottom_blob_index_0 = binaryop->bottoms[0];
        int bottom_blob_index_1 = binaryop->bottoms[1];

        size_t j0 = 0;
        for (; j0 < i; j0++)
        {
            if (layers[j0]->type != "BinaryOp")
                continue;

            if (layers[j0]->bottoms.size() != 1)
                continue;

            if (((ncnn::BinaryOp*)layers[j0])->op_type != ncnn::BinaryOp::Operation_MUL)
                continue;

            if (layers[j0]->tops[0] == bottom_blob_index_0)
                break;
        }

        size_t j1 = 0;
        for (; j1 < i; j1++)
        {
            if (layers[j1]->type != "BinaryOp")
                continue;

            if (layers[j1]->bottoms.size() != 1)
                continue;

            if (((ncnn::BinaryOp*)layers[j1])->op_type != ncnn::BinaryOp::Operation_MUL)
                continue;

            if (layers[j1]->tops[0] == bottom_blob_index_1)
                break;
        }

        if (j0 == i && j1 == i)
            continue;

        ncnn::BinaryOp* binaryop0 = (ncnn::BinaryOp*)layers[j0];
        ncnn::BinaryOp* binaryop1 = (ncnn::BinaryOp*)layers[j1];

        fprintf(stderr, "fuse_binaryop_eltwise %s %s %s\n", binaryop0->name.c_str(), binaryop1->name.c_str(), binaryop->name.c_str());

        ncnn::Eltwise* eltwise = (ncnn::Eltwise*)ncnn::create_layer("Eltwise");

        eltwise->type = "Eltwise";
        eltwise->name = binaryop->name;
        eltwise->bottoms = binaryop->bottoms;
        eltwise->tops = binaryop->tops;

        ncnn::ParamDict pd;
        eltwise->load_param(pd);

        eltwise->op_type = ncnn::Eltwise::Operation_SUM;

        eltwise->coeffs = ncnn::Mat(2);

        if (j0 != i && j1 != i)
        {
            // fuse BinaryOp - BinaryOp - BinaryOp to Eltwise
            eltwise->coeffs[0] = binaryop0->b;
            eltwise->coeffs[1] = binaryop1->b;

            eltwise->bottoms[0] = binaryop0->bottoms[0];
            eltwise->bottoms[1] = binaryop1->bottoms[0];

            binaryop0->type = "ncnnfused";
            binaryop1->type = "ncnnfused";
        }
        if (j0 != i && j1 == i)
        {
            // fuse BinaryOp - X - BinaryOp to Eltwise
            eltwise->coeffs[0] = binaryop0->b;
            eltwise->coeffs[1] = 1.f;

            eltwise->bottoms[0] = binaryop0->bottoms[0];

            binaryop0->type = "ncnnfused";
        }
        if (j0 == i && j1 != i)
        {
            // fuse X - BinaryOp - BinaryOp to Eltwise
            eltwise->coeffs[0] = 1.f;
            eltwise->coeffs[1] = binaryop1->b;

            eltwise->bottoms[1] = binaryop1->bottoms[0];

            binaryop1->type = "ncnnfused";
        }

        layers[i] = eltwise;
        delete binaryop;
    }

    return 0;
}